

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::formatsecs(vector<char> *timebuf,uint secs)

{
  uint uVar1;
  char *__s;
  bool bVar2;
  undefined8 in_RAX;
  size_t sVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  undefined8 uStack_38;
  
  lVar5 = 0;
  bVar2 = false;
  uStack_38 = in_RAX;
  do {
    uVar1 = *(uint *)(timedivinfos + lVar5 + 8);
    if ((uVar1 <= secs) || ((bVar6 = false, lVar5 == 0x40 && (!bVar2)))) {
      if (bVar2) {
        uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        vector<char>::add(timebuf,(char *)((long)&uStack_38 + 7));
      }
      iVar4 = timebuf->ulen + 0xb;
      if (timebuf->alen < iVar4) {
        vector<char>::growbuf(timebuf,iVar4);
      }
      iVar4 = snprintf(timebuf->buf + timebuf->ulen,0xb,"%u",(ulong)secs / (ulong)uVar1);
      if (9 < iVar4) {
        iVar4 = 10;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      timebuf->ulen = timebuf->ulen + iVar4;
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      vector<char>::add(timebuf,(char *)((long)&uStack_38 + 6));
      __s = *(char **)(timedivinfos + lVar5);
      sVar3 = strlen(__s);
      vector<char>::put(timebuf,__s,(int)sVar3);
      if ((int)((ulong)secs / (ulong)uVar1) != 1) {
        uStack_38._0_6_ = CONCAT15(0x73,(undefined5)uStack_38);
        vector<char>::add(timebuf,(char *)((long)&uStack_38 + 5));
      }
      bVar6 = secs % uVar1 == 0;
      bVar2 = true;
      secs = secs % uVar1;
    }
  } while ((!bVar6) && (lVar5 = lVar5 + 0x10, lVar5 != 0x50));
  return;
}

Assistant:

void formatsecs(vector<char> &timebuf, uint secs)
    {
        bool moded = false;
        const size_t tl = sizeof(timedivinfos)/sizeof(timedivinfos[0]);
        for(size_t i = 0; i < tl; i++)
        {
            uint t = secs / timedivinfos[i].timediv;
            if(!t && (i+1<tl || moded)) continue;
            secs %= timedivinfos[i].timediv;
            if(moded) timebuf.add(' ');
            moded = true;
            charbuf b = timebuf.reserve(10 + 1);
            int blen = b.remaining();
            int plen = snprintf(b.buf, blen, "%u", t);
            timebuf.advance(clamp(plen, 0, blen-1));
            timebuf.add(' ');
            timebuf.put(timedivinfos[i].name, strlen(timedivinfos[i].name));
            if(t != 1) timebuf.add('s');
            if(!secs) break;
        }
    }